

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O2

ostream * tchecker::refdbm::output(ostream *os,db_t *rdbm,reference_clock_variables_t *r)

{
  uint uVar1;
  bool bVar2;
  db_t dVar3;
  size_t sVar4;
  string *psVar5;
  ostream *poVar6;
  uint id;
  uint uVar7;
  db_t *db;
  int iVar8;
  ulong uVar9;
  int iVar10;
  uint id_00;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  db_t cij;
  db_t cji;
  string local_50;
  
  sVar4 = index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)r);
  std::operator<<(os,"(");
  uVar1 = (uint)sVar4;
  bVar2 = true;
  uVar7 = 1;
  uVar9 = sVar4 & 0xffffffff;
  uVar11 = 1;
  id = 0;
  while (id != uVar1) {
    iVar10 = (int)uVar11;
    iVar8 = (int)uVar9;
    uVar12 = uVar11;
    uVar13 = uVar7;
    while( true ) {
      id_00 = (uint)uVar11;
      if ((sVar4 & 0xffffffff) <= uVar12) break;
      cij = rdbm[uVar13];
      cji = rdbm[uVar9];
      dVar3 = tchecker::dbm::sum(&cij,&cji);
      if (dVar3 == (db_t)0x1) {
        if (!bVar2) {
          std::operator<<(os," & ");
        }
        psVar5 = variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::name((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)r,id);
        poVar6 = std::operator<<(os,(string *)psVar5);
        poVar6 = std::operator<<(poVar6,"=");
        psVar5 = variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::name((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)r,id_00);
        std::operator<<(poVar6,(string *)psVar5);
        if ((int)cij >> 1 < 1) {
          if ((int)cij >> 1 < 0) {
            poVar6 = std::operator<<(os,"-");
            std::ostream::operator<<((ostream *)poVar6,-((int)cij >> 1));
          }
        }
        else {
          poVar6 = std::operator<<(os,"+");
          std::ostream::operator<<((ostream *)poVar6,(int)cij >> 1);
        }
        bVar2 = false;
      }
      else if (cji != (db_t)0x7ffffffe || cij != (db_t)0x7ffffffe) {
        if (!bVar2) {
          std::operator<<(os," & ");
        }
        if (cji != (db_t)0x7ffffffe) {
          auVar14 = std::ostream::operator<<((ostream *)os,-((int)cji >> 1));
          tchecker::dbm::comparator_str_abi_cxx11_(&local_50,(dbm *)&cji,auVar14._8_8_);
          std::operator<<(auVar14._0_8_,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        psVar5 = variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::name((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)r,id);
        poVar6 = std::operator<<(os,(string *)psVar5);
        poVar6 = std::operator<<(poVar6,"-");
        psVar5 = variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::name((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)r,id_00);
        std::operator<<(poVar6,(string *)psVar5);
        if (cij != (db_t)0x7ffffffe) {
          tchecker::dbm::comparator_str_abi_cxx11_(&local_50,(dbm *)&cij,db);
          poVar6 = std::operator<<(os,(string *)&local_50);
          std::ostream::operator<<((ostream *)poVar6,(int)cij >> 1);
          std::__cxx11::string::~string((string *)&local_50);
        }
        bVar2 = false;
      }
      uVar12 = uVar12 + 1;
      uVar11 = (ulong)(id_00 + 1);
      uVar9 = (ulong)((int)uVar9 + uVar1);
      uVar13 = uVar13 + 1;
    }
    uVar11 = (ulong)(iVar10 + 1);
    uVar9 = (ulong)(iVar8 + uVar1 + 1);
    uVar7 = uVar7 + uVar1 + 1;
    id = id + 1;
  }
  std::operator<<(os,")");
  return os;
}

Assistant:

std::ostream & output(std::ostream & os, tchecker::dbm::db_t const * rdbm, tchecker::reference_clock_variables_t const & r)
{
  tchecker::clock_id_t const rdim = r.size();
  bool first = true;

  os << "(";

  for (tchecker::clock_id_t i = 0; i < rdim; ++i) {
    for (tchecker::clock_id_t j = i + 1; j < rdim; ++j) {
      tchecker::dbm::db_t cij = RDBM(i, j), cji = RDBM(j, i);
      // vi == vj + k
      if (tchecker::dbm::sum(cij, cji) == tchecker::dbm::LE_ZERO) {
        if (!first)
          os << " & ";
        first = false;

        os << r.name(i) << "=" << r.name(j);
        tchecker::integer_t vij = tchecker::dbm::value(cij);
        if (vij > 0)
          os << "+" << tchecker::dbm::value(cij);
        else if (vij < 0)
          os << "-" << -tchecker::dbm::value(cij);
      }
      // k1 <= xi - xj <= k2
      else if ((cij != tchecker::dbm::LT_INFINITY) || (cji != tchecker::dbm::LT_INFINITY)) {
        if (!first)
          os << " & ";
        first = false;

        if (cji != tchecker::dbm::LT_INFINITY)
          os << -tchecker::dbm::value(cji) << tchecker::dbm::comparator_str(cji);

        os << r.name(i) << "-" << r.name(j);

        if (cij != tchecker::dbm::LT_INFINITY)
          os << tchecker::dbm::comparator_str(cij) << tchecker::dbm::value(cij);
      }
    }
  }

  os << ")";

  return os;
}